

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void buglist_end_fun(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  undefined8 in_RSI;
  long in_RDI;
  char query [4608];
  char *query_00;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  
  query_00 = *(char **)(in_RDI + 0xf0);
  pcVar1 = log_time();
  sprintf(&stack0xffffffffffffede8,
          "INSERT INTO buglist VALUES(nullptr, \'%s\', \'%s\', \'%s\', \'%s\', 0)",query_00,pcVar1,
          *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0xd58),in_RSI);
  one_query(query_00);
  free_pstring(query_00);
  send_to_char(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
  return;
}

Assistant:

void buglist_end_fun(CHAR_DATA *ch, char *argument)
{
	char query[MSL];

	sprintf(query, "INSERT INTO buglist VALUES(nullptr, '%s', '%s', '%s', '%s', 0)",
		ch->true_name,
		log_time(),
		ch->pcdata->temp_str,
		argument);
	one_query(query);

	free_pstring(ch->pcdata->temp_str);
	send_to_char("Bug has been reported.\n\r", ch);
}